

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::valuesConvertedAsDouble
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Parameter *this)

{
  int *piVar1;
  invalid_argument *this_00;
  vector<double,_std::allocator<double>_> *out;
  int *piVar2;
  double local_28;
  
  if ((uint)(this->_data_type + CHAR) < 2) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    piVar1 = (this->_param_data_int).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar2 = (this->_param_data_int).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
      local_28 = (double)*piVar2;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,&local_28);
    }
  }
  else {
    if (this->_data_type == CHAR) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"CHAR type cannot be converted to FLOAT");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,&this->_param_data_double);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<double>
ezc3d::ParametersNS::GroupNS::Parameter::valuesConvertedAsDouble() const {
  if (_data_type == DATA_TYPE::BYTE || _data_type == DATA_TYPE::INT ||
      _data_type == DATA_TYPE::WORD) {
    std::vector<double> out;
    for (auto val : _param_data_int) {
      out.push_back(static_cast<double>(val));
    }
    return out;
  } else if (_data_type == DATA_TYPE::CHAR) {
    throw std::invalid_argument("CHAR type cannot be converted to FLOAT");
  } else if (_data_type == DATA_TYPE::WORD) {
    throw std::invalid_argument("WORD type cannot be converted to FLOAT");
  }
  return _param_data_double;
}